

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Uint(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
       *this,uint i)

{
  ulong *puVar1;
  
  if ((long)(this->stack_).stackEnd_ - (long)(this->stack_).stackTop_ < 0x10) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&this->stack_,1);
  }
  puVar1 = (ulong *)(this->stack_).stackTop_;
  (this->stack_).stackTop_ = (char *)(puVar1 + 2);
  *puVar1 = 0;
  puVar1[1] = 0;
  *puVar1 = (ulong)i;
  *(ushort *)((long)puVar1 + 0xe) = (ushort)(-1 < (int)i) << 5 | 0x1d6;
  return true;
}

Assistant:

bool Uint(unsigned i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }